

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

PktIn * pq_in_after(PacketQueueBase *pqb,PacketQueueNode *prev,_Bool pop)

{
  PacketQueueBase *node_00;
  PacketQueueNode *node;
  _Bool pop_local;
  PacketQueueNode *prev_local;
  PacketQueueBase *pqb_local;
  
  node_00 = (PacketQueueBase *)prev->next;
  if (node_00 == pqb) {
    pqb_local = (PacketQueueBase *)0x0;
  }
  else {
    if (pop) {
      pq_unlink_common(pqb,(PacketQueueNode *)node_00);
      (node_00->end).prev = pktin_freeq_head.prev;
      (node_00->end).next = &pktin_freeq_head;
      ((node_00->end).next)->prev = (PacketQueueNode *)node_00;
      ((node_00->end).prev)->next = (PacketQueueNode *)node_00;
      (node_00->end).on_free_queue = true;
      queue_idempotent_callback(&ic_pktin_free);
    }
    pqb_local = (PacketQueueBase *)&node_00[-1].total_size;
  }
  return (PktIn *)pqb_local;
}

Assistant:

static PktIn *pq_in_after(PacketQueueBase *pqb,
                          PacketQueueNode *prev, bool pop)
{
    PacketQueueNode *node = prev->next;
    if (node == &pqb->end)
        return NULL;

    if (pop) {
        pq_unlink_common(pqb, node);

        node->prev = pktin_freeq_head.prev;
        node->next = &pktin_freeq_head;
        node->next->prev = node;
        node->prev->next = node;
        node->on_free_queue = true;

        queue_idempotent_callback(&ic_pktin_free);
    }

    return container_of(node, PktIn, qnode);
}